

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O0

void nn_sws_init(nn_sws *self,int src,nn_ep *ep,nn_fsm *owner)

{
  nn_ws_handshake *in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  nn_fsm_fn in_RDI;
  nn_fsm *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_fffffffffffffff0;
  
  nn_fsm_init(unaff_retaddr,in_RDI,(nn_fsm_fn)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
              (int)((ulong)in_RDX >> 0x20),in_RCX,
              (nn_fsm *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  *(undefined4 *)(in_RDI + 0x58) = 1;
  nn_ws_handshake_init(in_RCX,in_stack_ffffffffffffffdc,(nn_fsm *)0x172171);
  *(undefined8 *)(in_RDI + 0x68) = 0;
  *(undefined4 *)(in_RDI + 0x1528) = 0xffffffff;
  *(undefined8 *)(in_RDI + 0x1530) = 0;
  nn_pipebase_init((nn_pipebase *)in_RCX,
                   (nn_pipebase_vfptr *)
                   CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),(nn_ep *)0x1721ba);
  *(undefined4 *)(in_RDI + 0x1620) = 0xffffffff;
  nn_list_init((nn_list *)(in_RDI + 0x1670));
  *(undefined4 *)(in_RDI + 0x17a0) = 0xffffffff;
  nn_msg_init((nn_msg *)in_RCX,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  *(undefined4 *)(in_RDI + 0x1650) = 0;
  memset(in_RDI + 0x1654,0,4);
  *(undefined8 *)(in_RDI + 0x1658) = 0;
  *(undefined4 *)(in_RDI + 0x1660) = 0;
  *(undefined4 *)(in_RDI + 0x1664) = 0;
  *(undefined4 *)(in_RDI + 0x1668) = 0;
  *(undefined4 *)(in_RDI + 0x166c) = 0;
  nn_fsm_event_init((nn_fsm_event *)0x172282);
  return;
}

Assistant:

void nn_sws_init (struct nn_sws *self, int src,
    struct nn_ep *ep, struct nn_fsm *owner)
{
    nn_fsm_init (&self->fsm, nn_sws_handler, nn_sws_shutdown,
        src, self, owner);
    self->state = NN_SWS_STATE_IDLE;
    nn_ws_handshake_init (&self->handshaker,
        NN_SWS_SRC_HANDSHAKE, &self->fsm);
    self->usock = NULL;
    self->usock_owner.src = -1;
    self->usock_owner.fsm = NULL;
    nn_pipebase_init (&self->pipebase, &nn_sws_pipebase_vfptr, ep);
    self->instate = -1;
    nn_list_init (&self->inmsg_array);
    self->outstate = -1;
    nn_msg_init (&self->outmsg, 0);

    self->continuing = 0;

    memset (self->utf8_code_pt_fragment, 0,
        NN_SWS_UTF8_MAX_CODEPOINT_LEN);
    self->utf8_code_pt_fragment_len = 0;

    self->pings_sent = 0;
    self->pongs_sent = 0;
    self->pings_received = 0;
    self->pongs_received = 0;

    nn_fsm_event_init (&self->done);
}